

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O2

void lws_accept_modulation(lws_context *context,lws_context_per_thread *pt,int allow)

{
  lws_vhost *plVar1;
  bool bVar2;
  lws_pollargs pa1;
  
  for (plVar1 = context->vhost_list; plVar1 != (lws_vhost *)0x0; plVar1 = plVar1->vhost_next) {
    if (plVar1->lserv_wsi != (lws *)0x0) {
      bVar2 = (int)pt == 0;
      _lws_change_pollfd(plVar1->lserv_wsi,(uint)bVar2,(uint)!bVar2,&pa1);
    }
  }
  return;
}

Assistant:

static void
lws_accept_modulation(struct lws_context *context,
		      struct lws_context_per_thread *pt, int allow)
{
	struct lws_vhost *vh = context->vhost_list;
	struct lws_pollargs pa1;

	while (vh) {
		if (vh->lserv_wsi) {
			if (allow)
				_lws_change_pollfd(vh->lserv_wsi,
					   0, LWS_POLLIN, &pa1);
			else
				_lws_change_pollfd(vh->lserv_wsi,
					   LWS_POLLIN, 0, &pa1);
		}
		vh = vh->vhost_next;
	}
}